

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

UniValue *
wallet::ProcessImportDescriptor
          (ImportData *import_data,
          map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
          *pubkey_map,
          map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          *privkey_map,set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *script_pub_keys,
          bool *have_solving_data,UniValue *data,
          vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>
          *ordered_pubkeys)

{
  insert_iterator<std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>_> __result;
  bool bVar1;
  __optional_eq_t<OutputType,_OutputType> _Var2;
  undefined1 uVar3;
  int iVar4;
  uint uVar5;
  pointer pDVar6;
  undefined4 extraout_var;
  size_type sVar7;
  bool *pbVar8;
  size_t sVar9;
  undefined8 uVar10;
  long in_RSI;
  UniValue *in_RDI;
  byte *in_R9;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<CScript>,_bool> pVar11;
  insert_iterator<std::map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>_>
  iVar12;
  insert_iterator<std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>_>
  iVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_>,_bool> pVar14;
  bool spendable;
  string *str;
  size_t i_1;
  pair<const_CScriptID,_CScript> *x;
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  *__range3_1;
  pair<const_CKeyID,_CPubKey> *key_pair;
  map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  *__range3;
  int i;
  value_type *parsed_desc;
  size_t j;
  UniValue *priv_keys;
  bool watch_only;
  string *descriptor;
  UniValue *warnings;
  CKey key;
  iterator __end3_1;
  iterator __begin3_1;
  iterator __end3;
  iterator __begin3;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  bool desc_internal;
  int64_t range_end;
  int64_t range_start;
  optional<bool> internal;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  parsed_descs;
  CKeyID id;
  CPubKey pubkey;
  FlatSigningProvider out_keys;
  string error;
  FlatSigningProvider keys;
  FlatSigningProvider *in_stack_fffffffffffff498;
  UniValue *in_stack_fffffffffffff4a0;
  undefined4 in_stack_fffffffffffff4a8;
  undefined1 in_stack_fffffffffffff4ac;
  undefined1 in_stack_fffffffffffff4ad;
  undefined1 uVar15;
  undefined1 in_stack_fffffffffffff4ae;
  undefined1 in_stack_fffffffffffff4af;
  _Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_> in_stack_fffffffffffff4b0;
  __range_iter_t<std::set<CScript>_> in_stack_fffffffffffff4b8;
  _Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
  in_stack_fffffffffffff4c0;
  _Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
  in_stack_fffffffffffff4c8;
  UniValue *in_stack_fffffffffffff4d8;
  undefined7 in_stack_fffffffffffff4e0;
  undefined7 uVar16;
  undefined1 in_stack_fffffffffffff4e7;
  undefined1 uVar17;
  undefined4 in_stack_fffffffffffff4e8;
  int in_stack_fffffffffffff4ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  __normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>
  in_stack_fffffffffffff4f0;
  __normal_iterator<CScript_*,_std::vector<CScript,_std::allocator<CScript>_>_>
  in_stack_fffffffffffff4f8;
  string *in_stack_fffffffffffff550;
  byte local_a49;
  bool local_972;
  bool local_962;
  long local_828;
  uint local_744;
  ulong local_738;
  undefined1 local_688 [28];
  byte local_66c;
  byte local_66b;
  allocator<char> local_66a;
  allocator<char> local_669 [24];
  allocator<char> local_651;
  pair<long,_long> local_650;
  allocator<char> local_63b [2];
  allocator<char> local_639;
  long local_638;
  undefined8 local_630;
  allocator<char> local_627;
  allocator<char> local_626;
  allocator<char> local_625;
  undefined1 local_624;
  undefined2 local_623;
  allocator<char> local_620;
  undefined2 local_61f;
  undefined4 local_61c;
  allocator<char> local_5f9;
  _Base_ptr local_5f8;
  undefined1 local_5f0;
  _Base_ptr local_5e8;
  undefined1 local_5e0;
  undefined8 local_5d8;
  undefined1 local_450 [104];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8 [21];
  undefined1 local_140 [312];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4b0._M_node);
  UniValue::UniValue((UniValue *)in_stack_fffffffffffff4b8._M_node,
                     (VType)((ulong)in_stack_fffffffffffff4b0._M_node >> 0x20),
                     (string *)
                     CONCAT17(in_stack_fffffffffffff4af,
                              CONCAT16(in_stack_fffffffffffff4ae,
                                       CONCAT15(in_stack_fffffffffffff4ad,
                                                CONCAT14(in_stack_fffffffffffff4ac,
                                                         in_stack_fffffffffffff4a8)))));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
             (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
             (allocator<char> *)in_stack_fffffffffffff4d8);
  UniValue::operator[]
            ((UniValue *)
             CONCAT17(in_stack_fffffffffffff4af,
                      CONCAT16(in_stack_fffffffffffff4ae,
                               CONCAT15(in_stack_fffffffffffff4ad,
                                        CONCAT14(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8
                                                )))),(string *)in_stack_fffffffffffff4a0);
  UniValue::get_str_abi_cxx11_(in_stack_fffffffffffff4a0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff498);
  std::allocator<char>::~allocator(&local_5f9);
  FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffff498);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4b0._M_node);
  Parse((string *)in_stack_fffffffffffff4f8._M_current,
        (FlatSigningProvider *)in_stack_fffffffffffff4f0._M_current,
        (string *)CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
        (bool)in_stack_fffffffffffff4e7);
  bVar1 = std::
          vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          ::empty((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffff4af,
                              CONCAT16(in_stack_fffffffffffff4ae,
                                       CONCAT15(in_stack_fffffffffffff4ad,
                                                CONCAT14(in_stack_fffffffffffff4ac,
                                                         in_stack_fffffffffffff4a8)))));
  if (bVar1) {
    uVar10 = __cxa_allocate_exception(0x58);
    JSONRPCError(in_stack_fffffffffffff4ec,(string *)in_stack_fffffffffffff4d8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(uVar10,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::at((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          *)CONCAT17(in_stack_fffffffffffff4af,
                     CONCAT16(in_stack_fffffffffffff4ae,
                              CONCAT15(in_stack_fffffffffffff4ad,
                                       CONCAT14(in_stack_fffffffffffff4ac,in_stack_fffffffffffff4a8)
                                      ))),(size_type)in_stack_fffffffffffff4a0);
    pDVar6 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                       ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                        in_stack_fffffffffffff498);
    iVar4 = (*pDVar6->_vptr_Descriptor[0xb])();
    local_5d8 = CONCAT44(extraout_var,iVar4);
    local_61c = 3;
    _Var2 = std::operator==((optional<OutputType> *)
                            CONCAT17(in_stack_fffffffffffff4af,
                                     CONCAT16(in_stack_fffffffffffff4ae,
                                              CONCAT15(in_stack_fffffffffffff4ad,
                                                       CONCAT14(in_stack_fffffffffffff4ac,
                                                                in_stack_fffffffffffff4a8)))),
                            &in_stack_fffffffffffff4a0->typ);
    if (_Var2) {
      uVar10 = __cxa_allocate_exception(0x58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                 (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                 (allocator<char> *)in_stack_fffffffffffff4d8);
      JSONRPCError(in_stack_fffffffffffff4ec,(string *)in_stack_fffffffffffff4d8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(uVar10,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      std::optional<bool>::optional((optional<bool> *)in_stack_fffffffffffff498);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                 (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                 (allocator<char> *)in_stack_fffffffffffff4d8);
      bVar1 = UniValue::exists(in_stack_fffffffffffff4a0,(string *)in_stack_fffffffffffff498);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_620);
      if (bVar1) {
        sVar7 = std::
                vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                ::size((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                        *)in_stack_fffffffffffff498);
        if (1 < sVar7) {
          uVar10 = __cxa_allocate_exception(0x58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                     (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                     (allocator<char> *)in_stack_fffffffffffff4d8);
          JSONRPCError(in_stack_fffffffffffff4ec,(string *)in_stack_fffffffffffff4d8);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(uVar10,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_015e9b42;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                   (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                   (allocator<char> *)in_stack_fffffffffffff4d8);
        UniValue::operator[]
                  ((UniValue *)
                   CONCAT17(in_stack_fffffffffffff4af,
                            CONCAT16(in_stack_fffffffffffff4ae,
                                     CONCAT15(in_stack_fffffffffffff4ad,
                                              CONCAT14(in_stack_fffffffffffff4ac,
                                                       in_stack_fffffffffffff4a8)))),
                   (string *)in_stack_fffffffffffff4a0);
        local_624 = UniValue::get_bool(in_stack_fffffffffffff4a0);
        std::optional<bool>::optional<bool,_true>
                  ((optional<bool> *)
                   CONCAT17(in_stack_fffffffffffff4af,
                            CONCAT16(in_stack_fffffffffffff4ae,
                                     CONCAT15(in_stack_fffffffffffff4ad,
                                              CONCAT14(in_stack_fffffffffffff4ac,
                                                       in_stack_fffffffffffff4a8)))),
                   (bool *)in_stack_fffffffffffff4a0);
        local_61f = local_623;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff498);
        std::allocator<char>::~allocator(&local_625);
      }
      std::
      vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ::at((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
            *)CONCAT17(in_stack_fffffffffffff4af,
                       CONCAT16(in_stack_fffffffffffff4ae,
                                CONCAT15(in_stack_fffffffffffff4ad,
                                         CONCAT14(in_stack_fffffffffffff4ac,
                                                  in_stack_fffffffffffff4a8)))),
           (size_type)in_stack_fffffffffffff4a0);
      pDVar6 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                         ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                          in_stack_fffffffffffff498);
      iVar4 = (*pDVar6->_vptr_Descriptor[3])();
      *in_R9 = (byte)iVar4 & 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                 (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                 (allocator<char> *)in_stack_fffffffffffff4d8);
      bVar1 = UniValue::exists(in_stack_fffffffffffff4a0,(string *)in_stack_fffffffffffff498);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                   (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                   (allocator<char> *)in_stack_fffffffffffff4d8);
        UniValue::operator[]
                  ((UniValue *)
                   CONCAT17(in_stack_fffffffffffff4af,
                            CONCAT16(in_stack_fffffffffffff4ae,
                                     CONCAT15(in_stack_fffffffffffff4ad,
                                              CONCAT14(in_stack_fffffffffffff4ac,
                                                       in_stack_fffffffffffff4a8)))),
                   (string *)in_stack_fffffffffffff4a0);
        local_962 = UniValue::get_bool(in_stack_fffffffffffff4a0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff498);
        std::allocator<char>::~allocator(&local_627);
      }
      else {
        local_962 = false;
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff498);
      std::allocator<char>::~allocator(&local_626);
      local_630 = 0;
      local_638 = 0;
      std::
      vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ::at((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
            *)CONCAT17(in_stack_fffffffffffff4af,
                       CONCAT16(in_stack_fffffffffffff4ae,
                                CONCAT15(in_stack_fffffffffffff4ad,
                                         CONCAT14(in_stack_fffffffffffff4ac,
                                                  in_stack_fffffffffffff4a8)))),
           (size_type)in_stack_fffffffffffff4a0);
      pDVar6 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                         ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                          in_stack_fffffffffffff498);
      uVar5 = (*pDVar6->_vptr_Descriptor[2])();
      local_972 = false;
      if ((uVar5 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                   (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                   (allocator<char> *)in_stack_fffffffffffff4d8);
        local_972 = UniValue::exists(in_stack_fffffffffffff4a0,(string *)in_stack_fffffffffffff498);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff498);
        std::allocator<char>::~allocator(&local_639);
      }
      if (local_972 == false) {
        std::
        vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ::at((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff4af,
                         CONCAT16(in_stack_fffffffffffff4ae,
                                  CONCAT15(in_stack_fffffffffffff4ad,
                                           CONCAT14(in_stack_fffffffffffff4ac,
                                                    in_stack_fffffffffffff4a8)))),
             (size_type)in_stack_fffffffffffff4a0);
        pDVar6 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                           ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                            in_stack_fffffffffffff498);
        uVar5 = (*pDVar6->_vptr_Descriptor[2])();
        if ((uVar5 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                     (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                     (allocator<char> *)in_stack_fffffffffffff4d8);
          bVar1 = UniValue::exists(in_stack_fffffffffffff4a0,(string *)in_stack_fffffffffffff498);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff498);
          std::allocator<char>::~allocator(local_63b);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            uVar10 = __cxa_allocate_exception(0x58);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                       (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                       (allocator<char> *)in_stack_fffffffffffff4d8);
            JSONRPCError(in_stack_fffffffffffff4ec,(string *)in_stack_fffffffffffff4d8);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              __cxa_throw(uVar10,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_015e9b42;
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                     (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                     (allocator<char> *)in_stack_fffffffffffff4d8);
          UniValue::operator[]
                    ((UniValue *)
                     CONCAT17(in_stack_fffffffffffff4af,
                              CONCAT16(in_stack_fffffffffffff4ae,
                                       CONCAT15(in_stack_fffffffffffff4ad,
                                                CONCAT14(in_stack_fffffffffffff4ac,
                                                         in_stack_fffffffffffff4a8)))),
                     (string *)in_stack_fffffffffffff4a0);
          local_650 = ParseDescriptorRange((UniValue *)in_stack_fffffffffffff4f0._M_current);
          std::tie<long,long>((long *)in_stack_fffffffffffff4a0,(long *)in_stack_fffffffffffff498);
          std::tuple<long&,long&>::operator=
                    ((tuple<long_&,_long_&> *)in_stack_fffffffffffff4b8._M_node,
                     (pair<long,_long> *)in_stack_fffffffffffff4b0._M_node);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff498);
          std::allocator<char>::~allocator(&local_651);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                   (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                   (allocator<char> *)in_stack_fffffffffffff4d8);
        bVar1 = UniValue::exists(in_stack_fffffffffffff4a0,(string *)in_stack_fffffffffffff498);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                     (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                     (allocator<char> *)in_stack_fffffffffffff4d8);
          UniValue::operator[]
                    ((UniValue *)
                     CONCAT17(in_stack_fffffffffffff4af,
                              CONCAT16(in_stack_fffffffffffff4ae,
                                       CONCAT15(in_stack_fffffffffffff4ad,
                                                CONCAT14(in_stack_fffffffffffff4ac,
                                                         in_stack_fffffffffffff4a8)))),
                     (string *)in_stack_fffffffffffff4a0);
          UniValue::get_array(in_stack_fffffffffffff4a0);
          UniValue::UniValue((UniValue *)in_stack_fffffffffffff4c8._M_node,
                             (UniValue *)in_stack_fffffffffffff4c0._M_node);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff498);
          std::allocator<char>::~allocator(&local_66a);
        }
        else {
          UniValue::UniValue((UniValue *)in_stack_fffffffffffff498);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff498);
        std::allocator<char>::~allocator(local_669);
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8);
        local_738 = 0;
        while( true ) {
          sVar7 = std::
                  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                  ::size((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                          *)in_stack_fffffffffffff498);
          if (sVar7 <= local_738) break;
          std::
          vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          ::at((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff4af,
                           CONCAT16(in_stack_fffffffffffff4ae,
                                    CONCAT15(in_stack_fffffffffffff4ad,
                                             CONCAT14(in_stack_fffffffffffff4ac,
                                                      in_stack_fffffffffffff4a8)))),
               (size_type)in_stack_fffffffffffff4a0);
          bVar1 = std::optional<bool>::has_value((optional<bool> *)in_stack_fffffffffffff498);
          local_a49 = 0;
          if (bVar1) {
            pbVar8 = std::optional<bool>::value
                               ((optional<bool> *)
                                CONCAT17(in_stack_fffffffffffff4af,
                                         CONCAT16(in_stack_fffffffffffff4ae,
                                                  CONCAT15(in_stack_fffffffffffff4ad,
                                                           CONCAT14(in_stack_fffffffffffff4ac,
                                                                    in_stack_fffffffffffff4a8)))));
            local_a49 = *pbVar8;
          }
          local_66b = local_a49 & 1;
          sVar7 = std::
                  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                  ::size((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                          *)in_stack_fffffffffffff498);
          if (sVar7 == 2) {
            local_66b = local_738 == 1;
          }
          else {
            sVar7 = std::
                    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                    ::size((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                            *)in_stack_fffffffffffff498);
            if (2 < sVar7) {
              local_66c = ~local_66b & 1;
              inline_check_non_fatal<bool>
                        ((bool *)in_stack_fffffffffffff4f8._M_current,
                         (char *)in_stack_fffffffffffff4f0._M_current,(int)((ulong)this >> 0x20),
                         (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                         (char *)in_stack_fffffffffffff4d8);
            }
          }
          for (local_744 = (uint)local_630; (int)local_744 <= local_638; local_744 = local_744 + 1)
          {
            FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffff498);
            std::vector<CScript,_std::allocator<CScript>_>::vector
                      ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffff498);
            pDVar6 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                               ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                                in_stack_fffffffffffff498);
            (*pDVar6->_vptr_Descriptor[8])(pDVar6,(ulong)local_744,local_140,local_688,local_450,0);
            std::vector<CScript,_std::allocator<CScript>_>::begin
                      ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffff4a0);
            std::vector<CScript,_std::allocator<CScript>_>::end
                      ((vector<CScript,_std::allocator<CScript>_> *)in_stack_fffffffffffff4a0);
            std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::end
                      ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
                       in_stack_fffffffffffff4a0);
            std::inserter<std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>_>
                      ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
                       CONCAT17(in_stack_fffffffffffff4af,
                                CONCAT16(in_stack_fffffffffffff4ae,
                                         CONCAT15(in_stack_fffffffffffff4ad,
                                                  CONCAT14(in_stack_fffffffffffff4ac,
                                                           in_stack_fffffffffffff4a8)))),
                       in_stack_fffffffffffff4b8);
            __result.container._7_1_ = in_stack_fffffffffffff4e7;
            __result.container._0_7_ = in_stack_fffffffffffff4e0;
            __result.iter._M_node._0_4_ = (int)this;
            __result.iter._M_node._4_4_ = (int)((ulong)this >> 0x20);
            std::
            copy<__gnu_cxx::__normal_iterator<CScript*,std::vector<CScript,std::allocator<CScript>>>,std::insert_iterator<std::set<CScript,std::less<CScript>,std::allocator<CScript>>>>
                      (in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,__result);
            std::
            map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
            ::begin((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                     *)in_stack_fffffffffffff4a0);
            std::
            map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
            ::end((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                   *)in_stack_fffffffffffff4a0);
            while( true ) {
              bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffff4af,
                                                        CONCAT16(in_stack_fffffffffffff4ae,
                                                                 CONCAT15(in_stack_fffffffffffff4ad,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffff4ac,
                                                  in_stack_fffffffffffff4a8)))),
                                      (_Self *)in_stack_fffffffffffff4a0);
              if (((bVar1 ^ 0xffU) & 1) == 0) break;
              std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>::operator*
                        ((_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_> *)
                         in_stack_fffffffffffff498);
              std::vector<std::pair<CKeyID,bool>,std::allocator<std::pair<CKeyID,bool>>>::
              emplace_back<CKeyID_const&,bool&>
                        ((vector<std::pair<CKeyID,_bool>,_std::allocator<std::pair<CKeyID,_bool>_>_>
                          *)in_stack_fffffffffffff4b8._M_node,
                         (CKeyID *)in_stack_fffffffffffff4b0._M_node,
                         (bool *)CONCAT17(in_stack_fffffffffffff4af,
                                          CONCAT16(in_stack_fffffffffffff4ae,
                                                   CONCAT15(in_stack_fffffffffffff4ad,
                                                            CONCAT14(in_stack_fffffffffffff4ac,
                                                                     in_stack_fffffffffffff4a8)))));
              std::_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>::operator++
                        ((_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_> *)
                         in_stack_fffffffffffff498);
            }
            std::
            map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
            ::begin((map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                     *)in_stack_fffffffffffff4a0);
            std::
            map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
            ::end((map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                   *)in_stack_fffffffffffff4a0);
            while( true ) {
              bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffff4af,
                                                        CONCAT16(in_stack_fffffffffffff4ae,
                                                                 CONCAT15(in_stack_fffffffffffff4ad,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffff4ac,
                                                  in_stack_fffffffffffff4a8)))),
                                      (_Self *)in_stack_fffffffffffff4a0);
              if (((bVar1 ^ 0xffU) & 1) == 0) break;
              std::_Rb_tree_iterator<std::pair<const_CScriptID,_CScript>_>::operator*
                        ((_Rb_tree_iterator<std::pair<const_CScriptID,_CScript>_> *)
                         in_stack_fffffffffffff498);
              pVar11 = std::set<CScript,std::less<CScript>,std::allocator<CScript>>::
                       emplace<CScript_const&>
                                 ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)
                                  CONCAT17(in_stack_fffffffffffff4af,
                                           CONCAT16(in_stack_fffffffffffff4ae,
                                                    CONCAT15(in_stack_fffffffffffff4ad,
                                                             CONCAT14(in_stack_fffffffffffff4ac,
                                                                      in_stack_fffffffffffff4a8)))),
                                  (CScript *)in_stack_fffffffffffff4a0);
              local_5e8 = (_Base_ptr)pVar11.first._M_node;
              local_5e0 = pVar11.second;
              std::_Rb_tree_iterator<std::pair<const_CScriptID,_CScript>_>::operator++
                        ((_Rb_tree_iterator<std::pair<const_CScriptID,_CScript>_> *)
                         in_stack_fffffffffffff498);
            }
            pDVar6 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                               ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                                in_stack_fffffffffffff498);
            (*pDVar6->_vptr_Descriptor[10])(pDVar6,(ulong)local_744,local_140,local_450);
            std::
            map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
            ::begin((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                     *)in_stack_fffffffffffff4a0);
            std::
            map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
            ::end((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                   *)in_stack_fffffffffffff4a0);
            std::
            map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
            ::end((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                   *)in_stack_fffffffffffff4a0);
            iVar12 = std::
                     inserter<std::map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>_>
                               ((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                                 *)CONCAT17(in_stack_fffffffffffff4af,
                                            CONCAT16(in_stack_fffffffffffff4ae,
                                                     CONCAT15(in_stack_fffffffffffff4ad,
                                                              CONCAT14(in_stack_fffffffffffff4ac,
                                                                       in_stack_fffffffffffff4a8))))
                                ,(__range_iter_t<std::map<CKeyID,_CPubKey>_>)
                                 in_stack_fffffffffffff4b8._M_node);
            in_stack_fffffffffffff550 = (string *)iVar12.container;
            iVar12.container._7_1_ = in_stack_fffffffffffff4e7;
            iVar12.container._0_7_ = in_stack_fffffffffffff4e0;
            iVar12.iter._M_node._0_4_ = (int)this;
            iVar12.iter._M_node._4_4_ = (int)((ulong)this >> 0x20);
            std::
            copy<std::_Rb_tree_iterator<std::pair<CKeyID_const,CPubKey>>,std::insert_iterator<std::map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>>>
                      ((_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>)
                       in_stack_fffffffffffff4f8._M_current,
                       (_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>)
                       in_stack_fffffffffffff4f0._M_current,iVar12);
            std::
            map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::
            begin((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                   *)in_stack_fffffffffffff4a0);
            std::
            map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::
            end((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                 *)in_stack_fffffffffffff4a0);
            std::
            map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>::
            end((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                 *)in_stack_fffffffffffff4a0);
            std::
            inserter<std::map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>_>
                      ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                        *)CONCAT17(in_stack_fffffffffffff4af,
                                   CONCAT16(in_stack_fffffffffffff4ae,
                                            CONCAT15(in_stack_fffffffffffff4ad,
                                                     CONCAT14(in_stack_fffffffffffff4ac,
                                                              in_stack_fffffffffffff4a8)))),
                       (__range_iter_t<std::map<CKeyID,_CKey>_>)in_stack_fffffffffffff4b8._M_node);
            iVar13.container._7_1_ = in_stack_fffffffffffff4e7;
            iVar13.container._0_7_ = in_stack_fffffffffffff4e0;
            iVar13.iter._M_node._0_4_ = (int)this;
            iVar13.iter._M_node._4_4_ = (int)((ulong)this >> 0x20);
            iVar13 = std::
                     copy<std::_Rb_tree_iterator<std::pair<CKeyID_const,CKey>>,std::insert_iterator<std::map<CKeyID,CKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>>>
                               ((_Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_>)
                                in_stack_fffffffffffff4f8._M_current,
                                (_Rb_tree_iterator<std::pair<const_CKeyID,_CKey>_>)
                                in_stack_fffffffffffff4f0._M_current,iVar13);
            in_stack_fffffffffffff4f8._M_current = (CScript *)iVar13.iter._M_node;
            in_stack_fffffffffffff4f0._M_current = (CScript *)(in_RSI + 0x70);
            this = local_3e8;
            std::
            map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
            ::begin((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                     *)in_stack_fffffffffffff4a0);
            std::
            map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
            ::end((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                   *)in_stack_fffffffffffff4a0);
            std::
            map<CKeyID,std::pair<CPubKey,KeyOriginInfo>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
            ::
            insert<std::_Rb_tree_iterator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>>
                      ((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                        *)in_stack_fffffffffffff498,
                       (_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                        )in_stack_fffffffffffff4b8._M_node,
                       (_Rb_tree_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                        )in_stack_fffffffffffff4b0._M_node);
            std::vector<CScript,_std::allocator<CScript>_>::~vector
                      ((vector<CScript,_std::allocator<CScript>_> *)
                       CONCAT17(in_stack_fffffffffffff4af,
                                CONCAT16(in_stack_fffffffffffff4ae,
                                         CONCAT15(in_stack_fffffffffffff4ad,
                                                  CONCAT14(in_stack_fffffffffffff4ac,
                                                           in_stack_fffffffffffff4a8)))));
            FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffff498);
          }
          local_738 = local_738 + 1;
        }
        local_828 = 0;
        while( true ) {
          uVar16 = (undefined7)local_828;
          uVar17 = (undefined1)((ulong)local_828 >> 0x38);
          sVar9 = UniValue::size((UniValue *)in_stack_fffffffffffff498);
          if (sVar9 <= CONCAT17(uVar17,uVar16)) break;
          in_stack_fffffffffffff4d8 =
               UniValue::operator[]
                         ((UniValue *)in_stack_fffffffffffff4b0._M_node,
                          CONCAT17(in_stack_fffffffffffff4af,
                                   CONCAT16(in_stack_fffffffffffff4ae,
                                            CONCAT15(in_stack_fffffffffffff4ad,
                                                     CONCAT14(in_stack_fffffffffffff4ac,
                                                              in_stack_fffffffffffff4a8)))));
          UniValue::get_str_abi_cxx11_(in_stack_fffffffffffff4a0);
          DecodeSecret(in_stack_fffffffffffff550);
          bVar1 = CKey::IsValid((CKey *)in_stack_fffffffffffff498);
          if (!bVar1) {
            uVar10 = __cxa_allocate_exception(0x58);
            std::allocator<char>::allocator();
            iVar4 = (int)((ulong)this >> 0x20);
            std::__cxx11::string::string<std::allocator<char>>
                      (this,(char *)CONCAT17(uVar17,uVar16),
                       (allocator<char> *)in_stack_fffffffffffff4d8);
            JSONRPCError(iVar4,(string *)in_stack_fffffffffffff4d8);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              __cxa_throw(uVar10,&UniValue::typeinfo,UniValue::~UniValue);
            }
            goto LAB_015e9b42;
          }
          CKey::GetPubKey((CKey *)in_stack_fffffffffffff4c0._M_node);
          CPubKey::GetID((CPubKey *)in_stack_fffffffffffff4c0._M_node);
          in_stack_fffffffffffff4b8._M_node =
               (_Base_ptr)
               std::
               map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
               ::count((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                        *)CONCAT17(in_stack_fffffffffffff4af,
                                   CONCAT16(in_stack_fffffffffffff4ae,
                                            CONCAT15(in_stack_fffffffffffff4ad,
                                                     CONCAT14(in_stack_fffffffffffff4ac,
                                                              in_stack_fffffffffffff4a8)))),
                       (key_type *)in_stack_fffffffffffff4a0);
          if ((UniValue *)in_stack_fffffffffffff4b8._M_node == (UniValue *)0x0) {
            UniValue::UniValue<const_char_(&)[33],_char[33],_true>
                      ((UniValue *)CONCAT17(uVar17,uVar16),(char (*) [33])in_stack_fffffffffffff4d8)
            ;
            UniValue::push_back((UniValue *)in_stack_fffffffffffff4b0._M_node,
                                (UniValue *)
                                CONCAT17(in_stack_fffffffffffff4af,
                                         CONCAT16(in_stack_fffffffffffff4ae,
                                                  CONCAT15(in_stack_fffffffffffff4ad,
                                                           CONCAT14(in_stack_fffffffffffff4ac,
                                                                    in_stack_fffffffffffff4a8)))));
            UniValue::~UniValue((UniValue *)in_stack_fffffffffffff498);
          }
          else {
            pVar14 = std::
                     map<CKeyID,CKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>
                     ::emplace<CKeyID&,CKey&>
                               ((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                                 *)in_stack_fffffffffffff4b8._M_node,
                                (CKeyID *)in_stack_fffffffffffff4b0._M_node,
                                (CKey *)CONCAT17(in_stack_fffffffffffff4af,
                                                 CONCAT16(in_stack_fffffffffffff4ae,
                                                          CONCAT15(in_stack_fffffffffffff4ad,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff4ac,
                                                  in_stack_fffffffffffff4a8)))));
            in_stack_fffffffffffff4b0 = pVar14.first._M_node;
            in_stack_fffffffffffff4af = pVar14.second;
            local_5f8 = in_stack_fffffffffffff4b0._M_node;
            local_5f0 = in_stack_fffffffffffff4af;
          }
          CKey::~CKey((CKey *)in_stack_fffffffffffff498);
          local_828 = local_828 + 1;
        }
        std::
        map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
        ::begin((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
                 *)in_stack_fffffffffffff4a0);
        std::
        map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
        ::end((map<CKeyID,_CPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
               *)in_stack_fffffffffffff4a0);
        uVar3 = std::
                all_of<std::_Rb_tree_iterator<std::pair<CKeyID_const,CPubKey>>,wallet::ProcessImportDescriptor(wallet::ImportData&,std::map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>&,std::map<CKeyID,CKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>&,std::set<CScript,std::less<CScript>,std::allocator<CScript>>&,bool&,UniValue_const&,std::vector<std::pair<CKeyID,bool>,std::allocator<std::pair<CKeyID,bool>>>&)::__0>
                          ((_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>)
                           in_stack_fffffffffffff4c8._M_node,
                           (_Rb_tree_iterator<std::pair<const_CKeyID,_CPubKey>_>)
                           in_stack_fffffffffffff4c0._M_node,
                           (anon_class_8_1_7f99e04d)in_stack_fffffffffffff4b8._M_node);
        bVar1 = false;
        if ((bool)uVar3) {
          std::
          map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          ::begin((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                   *)in_stack_fffffffffffff4a0);
          std::
          map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
          ::end((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                 *)in_stack_fffffffffffff4a0);
          in_stack_fffffffffffff4ac =
               std::
               all_of<std::_Rb_tree_iterator<std::pair<CKeyID_const,std::pair<CPubKey,KeyOriginInfo>>>,wallet::ProcessImportDescriptor(wallet::ImportData&,std::map<CKeyID,CPubKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>&,std::map<CKeyID,CKey,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CKey>>>&,std::set<CScript,std::less<CScript>,std::allocator<CScript>>&,bool&,UniValue_const&,std::vector<std::pair<CKeyID,bool>,std::allocator<std::pair<CKeyID,bool>>>&)::__1>
                         (in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,
                          (anon_class_8_1_7f99e04d)in_stack_fffffffffffff4b8._M_node);
          bVar1 = (bool)in_stack_fffffffffffff4ac;
        }
        uVar15 = bVar1;
        if ((local_962 == false) && (bVar1 == false)) {
          UniValue::UniValue<const_char_(&)[121],_char[121],_true>
                    ((UniValue *)CONCAT17(uVar17,uVar16),(char (*) [121])in_stack_fffffffffffff4d8);
          UniValue::push_back((UniValue *)in_stack_fffffffffffff4b0._M_node,
                              (UniValue *)
                              CONCAT17(in_stack_fffffffffffff4af,
                                       CONCAT16(uVar3,CONCAT15(uVar15,CONCAT14(
                                                  in_stack_fffffffffffff4ac,
                                                  in_stack_fffffffffffff4a8)))));
          UniValue::~UniValue((UniValue *)in_stack_fffffffffffff498);
        }
        if ((local_962 != false) && (bVar1 != false)) {
          UniValue::UniValue<const_char_(&)[128],_char[128],_true>
                    ((UniValue *)CONCAT17(uVar17,uVar16),(char (*) [128])in_stack_fffffffffffff4d8);
          UniValue::push_back((UniValue *)in_stack_fffffffffffff4b0._M_node,
                              (UniValue *)
                              CONCAT17(in_stack_fffffffffffff4af,
                                       CONCAT16(uVar3,CONCAT15(uVar15,CONCAT14(
                                                  in_stack_fffffffffffff4ac,
                                                  in_stack_fffffffffffff4a8)))));
          UniValue::~UniValue((UniValue *)in_stack_fffffffffffff498);
        }
        UniValue::~UniValue((UniValue *)in_stack_fffffffffffff498);
        std::
        vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
        ::~vector((vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffff4af,
                              CONCAT16(uVar3,CONCAT15(uVar15,CONCAT14(in_stack_fffffffffffff4ac,
                                                                      in_stack_fffffffffffff4a8)))))
        ;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff498);
        FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffff498);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          return in_RDI;
        }
      }
      else {
        uVar10 = __cxa_allocate_exception(0x58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff4ec,in_stack_fffffffffffff4e8),
                   (char *)CONCAT17(in_stack_fffffffffffff4e7,in_stack_fffffffffffff4e0),
                   (allocator<char> *)in_stack_fffffffffffff4d8);
        JSONRPCError(in_stack_fffffffffffff4ec,(string *)in_stack_fffffffffffff4d8);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(uVar10,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
    }
  }
LAB_015e9b42:
  __stack_chk_fail();
}

Assistant:

static UniValue ProcessImportDescriptor(ImportData& import_data, std::map<CKeyID, CPubKey>& pubkey_map, std::map<CKeyID, CKey>& privkey_map, std::set<CScript>& script_pub_keys, bool& have_solving_data, const UniValue& data, std::vector<std::pair<CKeyID, bool>>& ordered_pubkeys)
{
    UniValue warnings(UniValue::VARR);

    const std::string& descriptor = data["desc"].get_str();
    FlatSigningProvider keys;
    std::string error;
    auto parsed_descs = Parse(descriptor, keys, error, /* require_checksum = */ true);
    if (parsed_descs.empty()) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, error);
    }
    if (parsed_descs.at(0)->GetOutputType() == OutputType::BECH32M) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Bech32m descriptors cannot be imported into legacy wallets");
    }

    std::optional<bool> internal;
    if (data.exists("internal")) {
        if (parsed_descs.size() > 1) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Cannot have multipath descriptor while also specifying \'internal\'");
        }
        internal = data["internal"].get_bool();
    }

    have_solving_data = parsed_descs.at(0)->IsSolvable();
    const bool watch_only = data.exists("watchonly") ? data["watchonly"].get_bool() : false;

    int64_t range_start = 0, range_end = 0;
    if (!parsed_descs.at(0)->IsRange() && data.exists("range")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Range should not be specified for an un-ranged descriptor");
    } else if (parsed_descs.at(0)->IsRange()) {
        if (!data.exists("range")) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Descriptor is ranged, please specify the range");
        }
        std::tie(range_start, range_end) = ParseDescriptorRange(data["range"]);
    }

    const UniValue& priv_keys = data.exists("keys") ? data["keys"].get_array() : UniValue();

    for (size_t j = 0; j < parsed_descs.size(); ++j) {
        const auto& parsed_desc = parsed_descs.at(j);
        bool desc_internal = internal.has_value() && internal.value();
        if (parsed_descs.size() == 2) {
            desc_internal = j == 1;
        } else if (parsed_descs.size() > 2) {
            CHECK_NONFATAL(!desc_internal);
        }
        // Expand all descriptors to get public keys and scripts, and private keys if available.
        for (int i = range_start; i <= range_end; ++i) {
            FlatSigningProvider out_keys;
            std::vector<CScript> scripts_temp;
            parsed_desc->Expand(i, keys, scripts_temp, out_keys);
            std::copy(scripts_temp.begin(), scripts_temp.end(), std::inserter(script_pub_keys, script_pub_keys.end()));
            for (const auto& key_pair : out_keys.pubkeys) {
                ordered_pubkeys.emplace_back(key_pair.first, desc_internal);
            }

            for (const auto& x : out_keys.scripts) {
                import_data.import_scripts.emplace(x.second);
            }

            parsed_desc->ExpandPrivate(i, keys, out_keys);

            std::copy(out_keys.pubkeys.begin(), out_keys.pubkeys.end(), std::inserter(pubkey_map, pubkey_map.end()));
            std::copy(out_keys.keys.begin(), out_keys.keys.end(), std::inserter(privkey_map, privkey_map.end()));
            import_data.key_origins.insert(out_keys.origins.begin(), out_keys.origins.end());
        }
    }

    for (size_t i = 0; i < priv_keys.size(); ++i) {
        const auto& str = priv_keys[i].get_str();
        CKey key = DecodeSecret(str);
        if (!key.IsValid()) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Invalid private key encoding");
        }
        CPubKey pubkey = key.GetPubKey();
        CKeyID id = pubkey.GetID();

        // Check if this private key corresponds to a public key from the descriptor
        if (!pubkey_map.count(id)) {
            warnings.push_back("Ignoring irrelevant private key.");
        } else {
            privkey_map.emplace(id, key);
        }
    }

    // Check if all the public keys have corresponding private keys in the import for spendability.
    // This does not take into account threshold multisigs which could be spendable without all keys.
    // Thus, threshold multisigs without all keys will be considered not spendable here, even if they are,
    // perhaps triggering a false warning message. This is consistent with the current wallet IsMine check.
    bool spendable = std::all_of(pubkey_map.begin(), pubkey_map.end(),
        [&](const std::pair<CKeyID, CPubKey>& used_key) {
            return privkey_map.count(used_key.first) > 0;
        }) && std::all_of(import_data.key_origins.begin(), import_data.key_origins.end(),
        [&](const std::pair<CKeyID, std::pair<CPubKey, KeyOriginInfo>>& entry) {
            return privkey_map.count(entry.first) > 0;
        });
    if (!watch_only && !spendable) {
        warnings.push_back("Some private keys are missing, outputs will be considered watchonly. If this is intentional, specify the watchonly flag.");
    }
    if (watch_only && spendable) {
        warnings.push_back("All private keys are provided, outputs will be considered spendable. If this is intentional, do not specify the watchonly flag.");
    }

    return warnings;
}